

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

StatusOr<bool> * __thiscall draco::PlyReader::ParseProperty(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference value;
  undefined8 *in_RDX;
  string *in_RSI;
  StatusOr<bool> *in_RDI;
  DataType list_type;
  DataType data_type;
  bool property_list_search;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  bool property_search;
  string property_name;
  string list_type_str;
  string data_type_str;
  string line;
  DecoderBuffer line_buffer;
  PlyReader *in_stack_fffffffffffffd98;
  PlyProperty *in_stack_fffffffffffffda0;
  StatusOr<bool> *this_00;
  undefined4 in_stack_fffffffffffffda8;
  DataType in_stack_fffffffffffffdac;
  PlyElement *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  allocator<char> local_1b1;
  string *in_stack_fffffffffffffe50;
  PlyReader *in_stack_fffffffffffffe58;
  undefined1 local_161 [77];
  DataType local_114;
  undefined4 local_110;
  undefined1 local_10a;
  byte local_109;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  byte local_e9;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  bVar1 = std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::empty
                    ((vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *)
                     in_stack_fffffffffffffdb0);
  if (bVar1) {
    local_19 = 0;
    StatusOr<bool>::StatusOr
              ((StatusOr<bool> *)in_stack_fffffffffffffda0,(bool *)in_stack_fffffffffffffd98);
  }
  else {
    local_28 = local_18[6];
    local_58 = *local_18;
    uStack_50 = local_18[1];
    local_48 = local_18[2];
    uStack_40 = local_18[3];
    local_38 = local_18[4];
    uStack_30 = local_18[5];
    std::__cxx11::string::string(local_78);
    parser::ParseLine((DecoderBuffer *)in_stack_fffffffffffffdb0,
                      (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::__cxx11::string::string(local_a8);
    std::__cxx11::string::string(local_c8);
    std::__cxx11::string::string(local_e8);
    local_e9 = 0;
    SplitWords(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_108);
    if (2 < sVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_108,0);
      bVar1 = std::operator==(&in_stack_fffffffffffffda0->name_,(char *)in_stack_fffffffffffffd98);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_108,1);
        bVar1 = std::operator!=(&in_stack_fffffffffffffda0->name_,(char *)in_stack_fffffffffffffd98)
        ;
        if (bVar1) {
          local_e9 = 1;
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_108,1);
          std::__cxx11::string::operator=(local_a8,(string *)pvVar3);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_108,2);
          std::__cxx11::string::operator=(local_e8,(string *)pvVar3);
        }
      }
    }
    local_109 = 0;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_108);
    if (4 < sVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_108,0);
      bVar1 = std::operator==(&in_stack_fffffffffffffda0->name_,(char *)in_stack_fffffffffffffd98);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_108,1);
        bVar1 = std::operator==(&in_stack_fffffffffffffda0->name_,(char *)in_stack_fffffffffffffd98)
        ;
        if (bVar1) {
          local_109 = 1;
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_108,2);
          std::__cxx11::string::operator=(local_c8,(string *)pvVar3);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_108,3);
          std::__cxx11::string::operator=(local_a8,(string *)pvVar3);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_108,4);
          std::__cxx11::string::operator=(local_e8,(string *)pvVar3);
        }
      }
    }
    if (((local_e9 & 1) == 0) && ((local_109 & 1) == 0)) {
      local_10a = 0;
      StatusOr<bool>::StatusOr
                ((StatusOr<bool> *)in_stack_fffffffffffffda0,(bool *)in_stack_fffffffffffffd98);
    }
    else {
      local_114 = GetDataTypeFromString(in_stack_fffffffffffffd98,(string *)0x144411);
      if (local_114 == DT_INVALID) {
        in_stack_fffffffffffffdb0 = (PlyElement *)local_161;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),(char *)in_RSI,
                   (allocator<char> *)in_RDI);
        Status::Status((Status *)in_stack_fffffffffffffda0,
                       (Code)((ulong)in_stack_fffffffffffffd98 >> 0x20),(string *)0x144477);
        StatusOr<bool>::StatusOr
                  ((StatusOr<bool> *)in_stack_fffffffffffffda0,(Status *)in_stack_fffffffffffffd98);
        Status::~Status((Status *)0x14449a);
        std::__cxx11::string::~string((string *)(local_161 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_161);
      }
      else if (((local_109 & 1) == 0) ||
              (in_stack_fffffffffffffdac =
                    GetDataTypeFromString(in_stack_fffffffffffffd98,(string *)0x14455b),
              in_stack_fffffffffffffdac != DT_INVALID)) {
        value = std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::back
                          ((vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *)
                           in_stack_fffffffffffffda0);
        PlyProperty::PlyProperty
                  ((PlyProperty *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                   in_RSI,(DataType)((ulong)in_RDI >> 0x20),(DataType)in_RDI);
        PlyElement::AddProperty
                  (in_stack_fffffffffffffdb0,
                   (PlyProperty *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        PlyProperty::~PlyProperty(in_stack_fffffffffffffda0);
        *(undefined4 *)(local_18 + 6) = (undefined4)local_28;
        local_18[4] = local_38;
        local_18[5] = uStack_30;
        local_18[2] = local_48;
        local_18[3] = uStack_40;
        *local_18 = local_58;
        local_18[1] = uStack_50;
        StatusOr<bool>::StatusOr((StatusOr<bool> *)in_stack_fffffffffffffda0,(bool *)value);
      }
      else {
        this_00 = (StatusOr<bool> *)&local_1b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),(char *)in_RSI,
                   (allocator<char> *)in_RDI);
        Status::Status(&this_00->status_,(Code)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                       (string *)0x1445c1);
        StatusOr<bool>::StatusOr(this_00,(Status *)in_stack_fffffffffffffd98);
        Status::~Status((Status *)0x1445e4);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
        std::allocator<char>::~allocator(&local_1b1);
      }
    }
    local_110 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_78);
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x14478c);
  }
  return in_RDI;
}

Assistant:

StatusOr<bool> PlyReader::ParseProperty(DecoderBuffer *buffer) {
  if (elements_.empty()) {
    return false;  // Ignore properties if there is no active element.
  }
  DecoderBuffer line_buffer(*buffer);
  std::string line;
  parser::ParseLine(&line_buffer, &line);

  std::string data_type_str, list_type_str, property_name;
  bool property_search = false;
  const std::vector<std::string> words = SplitWords(line);
  if (words.size() >= 3 && words[0] == "property" && words[1] != "list") {
    property_search = true;
    data_type_str = words[1];
    property_name = words[2];
  }

  bool property_list_search = false;
  if (words.size() >= 5 && words[0] == "property" && words[1] == "list") {
    property_list_search = true;
    list_type_str = words[2];
    data_type_str = words[3];
    property_name = words[4];
  }
  if (!property_search && !property_list_search) {
    return false;
  }
  const DataType data_type = GetDataTypeFromString(data_type_str);
  if (data_type == DT_INVALID) {
    return Status(Status::INVALID_PARAMETER, "Wrong property data type");
  }
  DataType list_type = DT_INVALID;
  if (property_list_search) {
    list_type = GetDataTypeFromString(list_type_str);
    if (list_type == DT_INVALID) {
      return Status(Status::INVALID_PARAMETER, "Wrong property list type");
    }
  }
  elements_.back().AddProperty(
      PlyProperty(property_name, data_type, list_type));
  *buffer = line_buffer;
  return true;
}